

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.h
# Opt level: O2

iterator __thiscall
cmList::insert(cmList *this,const_iterator pos,string_view value,ExpandElements expandElements,
              EmptyElements emptyElements)

{
  iterator iVar1;
  allocator<char> local_59;
  string local_58;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  local_38._M_str = value._M_str;
  local_38._M_len = value._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_58,&local_38,&local_59);
  iVar1 = Insert(&this->Values,pos._M_current,&local_58,expandElements,emptyElements);
  std::__cxx11::string::~string((string *)&local_58);
  return (iterator)iVar1._M_current;
}

Assistant:

iterator insert(const_iterator pos, cm::string_view value,
                  ExpandElements expandElements = ExpandElements::Yes,
                  EmptyElements emptyElements = EmptyElements::No)
  {
    return cmList::Insert(this->Values, pos, std::string(value),
                          expandElements, emptyElements);
  }